

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddInv.c
# Opt level: O3

DdNode * cuddAddScalarInverseRecur(DdManager *dd,DdNode *f,DdNode *epsilon)

{
  int *piVar1;
  double dVar2;
  DdNode *pDVar3;
  DdNode *E;
  DdNode *data;
  double dVar4;
  
  if (f->index == 0x7fffffff) {
    dVar2 = (f->type).value;
    dVar4 = -dVar2;
    if (-dVar2 <= dVar2) {
      dVar4 = dVar2;
    }
    if ((epsilon->type).value <= dVar4) {
      pDVar3 = cuddUniqueConst(dd,1.0 / dVar2);
      return pDVar3;
    }
  }
  else {
    pDVar3 = cuddCacheLookup2(dd,Cudd_addScalarInverse,f,epsilon);
    if (pDVar3 != (DdNode *)0x0) {
      return pDVar3;
    }
    pDVar3 = cuddAddScalarInverseRecur(dd,(f->type).kids.T,epsilon);
    if (pDVar3 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      E = cuddAddScalarInverseRecur(dd,(f->type).kids.E,epsilon);
      if (E != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)E & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        data = pDVar3;
        if ((pDVar3 == E) || (data = cuddUniqueInter(dd,f->index,pDVar3,E), data != (DdNode *)0x0))
        {
          piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + -1;
          piVar1 = (int *)(((ulong)E & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + -1;
          cuddCacheInsert2(dd,Cudd_addScalarInverse,f,epsilon,data);
          return data;
        }
        Cudd_RecursiveDeref(dd,pDVar3);
        pDVar3 = E;
      }
      Cudd_RecursiveDeref(dd,pDVar3);
    }
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode *
cuddAddScalarInverseRecur(
  DdManager * dd,
  DdNode * f,
  DdNode * epsilon)
{
    DdNode *t, *e, *res;
    CUDD_VALUE_TYPE value;

    statLine(dd);
    if (cuddIsConstant(f)) {
        if (ddAbs(cuddV(f)) < cuddV(epsilon)) return(NULL);
        value = 1.0 / cuddV(f);
        res = cuddUniqueConst(dd,value);
        return(res);
    }

    res = cuddCacheLookup2(dd,Cudd_addScalarInverse,f,epsilon);
    if (res != NULL) return(res);

    t = cuddAddScalarInverseRecur(dd,cuddT(f),epsilon);
    if (t == NULL) return(NULL);
    cuddRef(t);

    e = cuddAddScalarInverseRecur(dd,cuddE(f),epsilon);
    if (e == NULL) {
        Cudd_RecursiveDeref(dd, t);
        return(NULL);
    }
    cuddRef(e);

    res = (t == e) ? t : cuddUniqueInter(dd,(int)f->index,t,e);
    if (res == NULL) {
        Cudd_RecursiveDeref(dd, t);
        Cudd_RecursiveDeref(dd, e);
        return(NULL);
    }
    cuddDeref(t);
    cuddDeref(e);

    cuddCacheInsert2(dd,Cudd_addScalarInverse,f,epsilon,res);

    return(res);

}